

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O2

UniquePtr<EC_GROUP> NewSecp160r1Group(void)

{
  _Head_base<0UL,_ec_group_st_*,_false> group_00;
  _Head_base<0UL,_ec_point_st_*,_false> generator;
  int iVar1;
  UniquePtr<BIGNUM> UVar2;
  BIGNUM *cofactor;
  __uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true> in_RDI;
  undefined1 auVar3 [16];
  UniquePtr<EC_GROUP> group;
  UniquePtr<BIGNUM> n;
  UniquePtr<BIGNUM> y;
  UniquePtr<BIGNUM> x;
  UniquePtr<EC_POINT> g;
  UniquePtr<BIGNUM> b;
  UniquePtr<BIGNUM> a;
  UniquePtr<BIGNUM> p;
  _Head_base<0UL,_ec_group_st_*,_false> local_60;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_58;
  __uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> local_50;
  __uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> local_48;
  _Head_base<0UL,_ec_point_st_*,_false> local_40;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_38;
  __uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> local_30;
  __uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> local_28;
  
  HexToBIGNUM((char *)&local_28);
  HexToBIGNUM((char *)&local_30);
  HexToBIGNUM((char *)&local_38);
  HexToBIGNUM((char *)&local_48);
  HexToBIGNUM((char *)&local_50);
  UVar2 = HexToBIGNUM((char *)&local_58);
  if ((local_28._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
       (_Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>)0x0) &&
     (local_30._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>)0x0)) {
    auVar3._0_4_ = -(uint)(local_38._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                           _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ == 0 &&
                          (int)local_38._M_t.
                               super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl == 0);
    auVar3._4_4_ = -(uint)((int)local_48._M_t.
                                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl == 0 &&
                          local_48._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                          .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ == 0);
    auVar3._8_4_ = -(uint)(local_50._M_t.
                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ == 0 &&
                          (int)local_50._M_t.
                               super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl == 0);
    auVar3._12_4_ =
         -(uint)((int)local_58._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl == 0 &&
                local_58._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._4_4_ == 0);
    iVar1 = movmskps((int)UVar2._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,auVar3);
    if (iVar1 == 0) {
      local_60._M_head_impl =
           (ec_group_st *)
           EC_GROUP_new_curve_GFp
                     ((BIGNUM *)
                      local_28._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                      (BIGNUM *)
                      local_30._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                      (BIGNUM *)
                      local_38._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BN_CTX *)0x0);
      if (local_60._M_head_impl == (ec_group_st *)0x0) {
        *(undefined8 *)
         in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl = 0;
      }
      else {
        local_40._M_head_impl = (ec_point_st *)EC_POINT_new((EC_GROUP *)local_60._M_head_impl);
        if (local_40._M_head_impl == (ec_point_st *)0x0) {
LAB_002b4d31:
          *(undefined8 *)
           in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl = 0;
        }
        else {
          iVar1 = EC_POINT_set_affine_coordinates_GFp
                            ((EC_GROUP *)local_60._M_head_impl,(EC_POINT *)local_40._M_head_impl,
                             (BIGNUM *)
                             local_48._M_t.
                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                             (BIGNUM *)
                             local_50._M_t.
                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BN_CTX *)0x0);
          generator._M_head_impl = local_40._M_head_impl;
          group_00._M_head_impl = local_60._M_head_impl;
          if (iVar1 == 0) goto LAB_002b4d31;
          cofactor = BN_value_one();
          iVar1 = EC_GROUP_set_generator
                            ((EC_GROUP *)group_00._M_head_impl,(EC_POINT *)generator._M_head_impl,
                             (BIGNUM *)
                             local_58._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                             ._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,cofactor);
          if (iVar1 == 0) goto LAB_002b4d31;
          *(ec_group_st **)
           in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl = local_60._M_head_impl;
          local_60._M_head_impl = (ec_group_st *)0x0;
        }
        std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_40);
      }
      std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&local_60);
      goto LAB_002b4c6c;
    }
  }
  *(undefined8 *)
   in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
   super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
   super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl = 0;
LAB_002b4c6c:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_58);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_30);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_28);
  return (__uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<ec_group_st_*,_bssl::internal::Deleter>)
         in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<EC_GROUP> NewSecp160r1Group() {
  static const char kP[] = "ffffffffffffffffffffffffffffffff7fffffff";
  static const char kA[] = "ffffffffffffffffffffffffffffffff7ffffffc";
  static const char kB[] = "1c97befc54bd7a8b65acf89f81d4d4adc565fa45";
  static const char kX[] = "4a96b5688ef573284664698968c38bb913cbfc82";
  static const char kY[] = "23a628553168947d59dcc912042351377ac5fb32";
  static const char kN[] = "0100000000000000000001f4c8f927aed3ca752257";

  bssl::UniquePtr<BIGNUM> p = HexToBIGNUM(kP), a = HexToBIGNUM(kA),
                          b = HexToBIGNUM(kB), x = HexToBIGNUM(kX),
                          y = HexToBIGNUM(kY), n = HexToBIGNUM(kN);
  if (!p || !a || !b || !x || !y || !n) {
    return nullptr;
  }

  bssl::UniquePtr<EC_GROUP> group(
      EC_GROUP_new_curve_GFp(p.get(), a.get(), b.get(), nullptr));
  if (!group) {
    return nullptr;
  }
  bssl::UniquePtr<EC_POINT> g(EC_POINT_new(group.get()));
  if (!g ||
      !EC_POINT_set_affine_coordinates_GFp(group.get(), g.get(), x.get(),
                                           y.get(), nullptr) ||
      !EC_GROUP_set_generator(group.get(), g.get(), n.get(), BN_value_one())) {
    return nullptr;
  }
  return group;
}